

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O1

void __thiscall ByteData_ByteDataConstructor_Test::TestBody(ByteData_ByteDataConstructor_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  uint32_t i;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  uint32_t size;
  ByteData byte_data;
  uint8_t target [20];
  AssertHelper local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  ByteData local_88;
  string local_70;
  AssertHelper local_50;
  uint local_44;
  ByteData local_40;
  byte local_28 [24];
  
  local_44 = 0x14;
  bVar2 = 1;
  lVar4 = 0;
  do {
    local_28[lVar4] = bVar2;
    bVar2 = bVar2 + 1;
    if (9 < bVar2) {
      bVar2 = 0;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  cfd::core::ByteData::ByteData(&local_40,local_28,0x14);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_70,&local_40);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_88,"byte_data.GetHex().c_str()",
             "\"0102030405060708090001020304050607080900\"",local_70._M_dataplus._M_p,
             "0102030405060708090001020304050607080900");
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_88.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x58,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cfd::core::ByteData::GetDataSize(&local_40);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_70,"byte_data.GetDataSize()","size",(unsigned_long *)&local_88,
             &local_44);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x59,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_88.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::core::ByteData::IsEmpty(&local_40);
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_88.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,!bVar3);
  local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&local_88,(AssertionResult *)"byte_data.IsEmpty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x5a,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_98.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
      local_98.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::Serialize(&local_88,&local_40);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_70,&local_88);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_98,"byte_data.Serialize().GetHex().c_str()",
             "\"140102030405060708090001020304050607080900\"",local_70._M_dataplus._M_p,
             "140102030405060708090001020304050607080900");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
               ,0x5d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ByteData, ByteDataConstructor) {
  uint8_t target[20];
  uint32_t size = 20;
  uint8_t byte = 1;
  for (uint32_t i = 0; i < size; i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData byte_data = ByteData(target, size);

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0102030405060708090001020304050607080900");
  EXPECT_EQ(byte_data.GetDataSize(), size);
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "140102030405060708090001020304050607080900");
}